

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_memset(void *ptr,int c0,nk_size size)

{
  nk_byte nVar1;
  uint uVar2;
  ulong uVar3;
  nk_byte *pnVar4;
  nk_size t;
  uint c;
  nk_byte *dst;
  nk_size size_local;
  int c0_local;
  void *ptr_local;
  
  c = c0 & 0xff;
  if (c != 0) {
    uVar2 = c << 8 | c;
    c = uVar2 << 0x10 | uVar2;
  }
  nVar1 = (nk_byte)c0;
  dst = (nk_byte *)ptr;
  size_local = size;
  if (size < 0xc) {
    while (size_local != 0) {
      *dst = nVar1;
      dst = dst + 1;
      size_local = size_local - 1;
    }
  }
  else {
    dst = (nk_byte *)ptr;
    if (((ulong)ptr & 3) != 0) {
      t = 4 - ((ulong)ptr & 3);
      size_local = size - t;
      dst = (nk_byte *)ptr;
      do {
        pnVar4 = dst + 1;
        *dst = nVar1;
        t = t - 1;
        dst = pnVar4;
      } while (t != 0);
    }
    t = size_local >> 2;
    do {
      *(uint *)dst = c;
      dst = dst + 4;
      t = t - 1;
    } while (t != 0);
    for (uVar3 = size_local & 3; uVar3 != 0; uVar3 = uVar3 - 1) {
      *dst = nVar1;
      dst = dst + 1;
    }
  }
  return;
}

Assistant:

NK_LIB void
nk_memset(void *ptr, int c0, nk_size size)
{
#define nk_word unsigned
#define nk_wsize sizeof(nk_word)
#define nk_wmask (nk_wsize - 1)
nk_byte *dst = (nk_byte*)ptr;
unsigned c = 0;
nk_size t = 0;

if ((c = (nk_byte)c0) != 0) {
c = (c << 8) | c; /* at least 16-bits  */
if (sizeof(unsigned int) > 2)
c = (c << 16) | c; /* at least 32-bits*/
}

/* too small of a word count */
dst = (nk_byte*)ptr;
if (size < 3 * nk_wsize) {
while (size--) *dst++ = (nk_byte)c0;
return;
}

/* align destination */
if ((t = NK_PTR_TO_UINT(dst) & nk_wmask) != 0) {
t = nk_wsize -t;
size -= t;
do {
*dst++ = (nk_byte)c0;
} while (--t != 0);
}

/* fill word */
t = size / nk_wsize;
do {
*(nk_word*)((void*)dst) = c;
dst += nk_wsize;
} while (--t != 0);

/* fill trailing bytes */
t = (size & nk_wmask);
if (t != 0) {
do {
*dst++ = (nk_byte)c0;
} while (--t != 0);
}

#undef nk_word
#undef nk_wsize
#undef nk_wmask
}